

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O0

int __thiscall mkvparser::MkvReader::Length(MkvReader *this,longlong *total,longlong *available)

{
  longlong *available_local;
  longlong *total_local;
  MkvReader *this_local;
  int local_4;
  
  if (this->m_file == (FILE *)0x0) {
    local_4 = -1;
  }
  else {
    if (total != (longlong *)0x0) {
      *total = this->m_length;
    }
    if (available != (longlong *)0x0) {
      *available = this->m_length;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MkvReader::Length(long long* total, long long* available) {
  if (m_file == NULL)
    return -1;

  if (total)
    *total = m_length;

  if (available)
    *available = m_length;

  return 0;
}